

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvers.cpp
# Opt level: O0

vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
* getPredefinedTransformations2Plane1Line<double>
            (vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
             *__return_storage_ptr__,Matrix<double,_4,_1,_0,_4,_1> *Pi1,
            Matrix<double,_4,_1,_0,_4,_1> *Pi2,Matrix<double,_4,_1,_0,_4,_1> *Nu1,
            Matrix<double,_4,_1,_0,_4,_1> *Nu2,bool verbose)

{
  Scalar *pSVar1;
  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *pCVar2;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *pCVar3;
  ostream *poVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  XprTypeNested local_408;
  Product<Eigen::Inverse<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>
  local_400;
  Type local_3f0;
  Type local_3b8;
  IdentityReturnType local_37b;
  double local_378;
  double local_370;
  Scalar local_368;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> local_360;
  double local_340;
  double local_338;
  double local_330;
  double local_328;
  double local_320;
  double local_318;
  double local_310;
  double local_308;
  double local_300;
  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> local_2f8;
  XprTypeNested local_2d8;
  Product<Eigen::Inverse<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>
  local_2d0;
  Type local_2c0;
  Type local_288;
  IdentityReturnType local_24b;
  double local_248;
  double local_240;
  Scalar local_238;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> local_230;
  double local_210;
  double local_208;
  double local_200;
  double local_1f8;
  double local_1f0;
  double local_1e8;
  double local_1e0;
  double local_1d8;
  double local_1d0;
  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> local_1c8;
  Scalar local_1a8;
  double nu24;
  double nu23;
  double nu22;
  double nu21;
  double nu14;
  double nu13;
  double nu12;
  double nu11;
  double pi24;
  double pi23;
  double pi22;
  double pi21;
  double pi14;
  double pi13;
  double pi12;
  double pi11;
  Matrix<double,_3,_1,_0,_3,_1> auxT;
  Matrix<double,_3,_3,_0,_3,_3> auxRot;
  undefined1 local_b8 [8];
  Matrix<double,_4,_4,_0,_4,_4> auxTrans;
  bool verbose_local;
  Matrix<double,_4,_1,_0,_4,_1> *Nu2_local;
  Matrix<double,_4,_1,_0,_4,_1> *Nu1_local;
  Matrix<double,_4,_1,_0,_4,_1> *Pi2_local;
  Matrix<double,_4,_1,_0,_4,_1> *Pi1_local;
  vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  *outTrans;
  
  auxTrans.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xf].
  _6_1_ = 0;
  auxTrans.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xf].
  _7_1_ = verbose;
  std::
  vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  ::vector(__return_storage_ptr__);
  Eigen::Matrix<double,_4,_4,_0,_4,_4>::Matrix((Matrix<double,_4,_4,_0,_4,_4> *)local_b8);
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix
            ((Matrix<double,_3,_3,_0,_3,_3> *)
             (auxT.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2));
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)&pi11);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)Pi1,0);
  pi12 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)Pi1,1);
  pi13 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)Pi1,2);
  pi14 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)Pi1,3);
  pi21 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)Pi2,0);
  pi22 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)Pi2,1);
  pi23 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)Pi2,2);
  pi24 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)Pi2,3);
  nu11 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)Nu1,0);
  nu12 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)Nu1,1);
  nu13 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)Nu1,2);
  nu14 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)Nu1,3);
  nu21 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)Nu2,0);
  nu22 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)Nu2,1);
  nu23 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)Nu2,2);
  nu24 = *pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)Nu2,3);
  local_1a8 = *pSVar1;
  dVar8 = pi14 * pi14;
  dVar5 = pi13 * pi13;
  dVar6 = pow(((dVar5 * pi22 + dVar8 * pi22) - pi12 * pi13 * pi23) - pi12 * pi14 * pi24,2.0);
  dVar7 = pow(pi13 * pi24 - pi14 * pi23,2.0);
  dVar5 = sqrt((dVar5 + dVar8) * dVar6 +
               dVar7 * (pi13 * pi13 + pi14 * pi14) * (pi14 * pi14 + pi12 * pi12 + pi13 * pi13));
  local_1d0 = (1.0 / dVar5) * (pi13 * pi24 - pi14 * pi23) * (pi13 * pi13 + pi14 * pi14);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator<<
            (&local_1c8,
             (DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
             (auxT.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2),&local_1d0);
  dVar8 = pi14 * pi14;
  dVar5 = pi13 * pi13;
  dVar6 = pow(((dVar5 * pi22 + dVar8 * pi22) - pi12 * pi13 * pi23) - pi12 * pi14 * pi24,2.0);
  dVar7 = pow(pi13 * pi24 - pi14 * pi23,2.0);
  dVar5 = sqrt((dVar5 + dVar8) * dVar6 +
               dVar7 * (pi13 * pi13 + pi14 * pi14) * (pi14 * pi14 + pi12 * pi12 + pi13 * pi13));
  local_1d8 = (-1.0 / dVar5) * (pi12 * pi24 - pi14 * pi22) * (pi13 * pi13 + pi14 * pi14);
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (&local_1c8,&local_1d8);
  dVar8 = pi14 * pi14;
  dVar5 = pi13 * pi13;
  dVar6 = pow(((dVar5 * pi22 + dVar8 * pi22) - pi12 * pi13 * pi23) - pi12 * pi14 * pi24,2.0);
  dVar7 = pow(pi13 * pi24 - pi14 * pi23,2.0);
  dVar5 = sqrt((dVar5 + dVar8) * dVar6 +
               dVar7 * (pi13 * pi13 + pi14 * pi14) * (pi14 * pi14 + pi12 * pi12 + pi13 * pi13));
  local_1e0 = (1.0 / dVar5) * (pi12 * pi23 - pi13 * pi22) * (pi13 * pi13 + pi14 * pi14);
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar2,&local_1e0);
  dVar8 = pi14 * pi14;
  dVar5 = pi13 * pi13;
  dVar6 = pow(((dVar5 * pi22 + dVar8 * pi22) - pi12 * pi13 * pi23) - pi12 * pi14 * pi24,2.0);
  dVar7 = pow(pi13 * pi24 - pi14 * pi23,2.0);
  dVar5 = sqrt((dVar5 + dVar8) * dVar6 +
               dVar7 * (pi13 * pi13 + pi14 * pi14) * (pi14 * pi14 + pi12 * pi12 + pi13 * pi13));
  dVar6 = pi14 * pi14;
  dVar8 = pi13 * pi13;
  dVar7 = sqrt(dVar6 + pi12 * pi12 + dVar8);
  local_1e8 = (((-1.0 / dVar5) * (dVar8 + dVar6)) / dVar7) *
              (((pi13 * pi13 * pi22 + pi14 * pi14 * pi22) - pi12 * pi13 * pi23) - pi12 * pi14 * pi24
              );
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar2,&local_1e8);
  dVar8 = pi14 * pi14;
  dVar5 = pi13 * pi13;
  dVar6 = pow(((dVar5 * pi22 + dVar8 * pi22) - pi12 * pi13 * pi23) - pi12 * pi14 * pi24,2.0);
  dVar7 = pow(pi13 * pi24 - pi14 * pi23,2.0);
  dVar5 = sqrt((dVar5 + dVar8) * dVar6 +
               dVar7 * (pi13 * pi13 + pi14 * pi14) * (pi14 * pi14 + pi12 * pi12 + pi13 * pi13));
  dVar6 = pi14 * pi14;
  dVar8 = pi13 * pi13;
  dVar7 = sqrt(dVar6 + pi12 * pi12 + dVar8);
  local_1f0 = (((-1.0 / dVar5) * (dVar8 + dVar6)) / dVar7) *
              (((pi12 * pi12 * pi23 + pi14 * pi14 * pi23) - pi12 * pi13 * pi22) - pi13 * pi14 * pi24
              );
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar2,&local_1f0);
  dVar8 = pi14 * pi14;
  dVar5 = pi13 * pi13;
  dVar6 = pow(((dVar5 * pi22 + dVar8 * pi22) - pi12 * pi13 * pi23) - pi12 * pi14 * pi24,2.0);
  dVar7 = pow(pi13 * pi24 - pi14 * pi23,2.0);
  dVar5 = sqrt((dVar5 + dVar8) * dVar6 +
               dVar7 * (pi13 * pi13 + pi14 * pi14) * (pi14 * pi14 + pi12 * pi12 + pi13 * pi13));
  dVar6 = pi14 * pi14;
  dVar8 = pi13 * pi13;
  dVar7 = sqrt(dVar6 + pi12 * pi12 + dVar8);
  local_1f8 = (((-1.0 / dVar5) * (dVar8 + dVar6)) / dVar7) *
              (((pi12 * pi12 * pi24 + pi13 * pi13 * pi24) - pi12 * pi14 * pi22) - pi13 * pi14 * pi23
              );
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar2,&local_1f8);
  dVar5 = pi12;
  local_200 = sqrt(pi14 * pi14 + pi12 * pi12 + pi13 * pi13);
  local_200 = dVar5 / local_200;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar2,&local_200);
  dVar5 = pi13;
  local_208 = sqrt(pi14 * pi14 + pi12 * pi12 + pi13 * pi13);
  local_208 = dVar5 / local_208;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar2,&local_208);
  dVar5 = pi14;
  local_210 = sqrt(pi14 * pi14 + pi12 * pi12 + pi13 * pi13);
  local_210 = dVar5 / local_210;
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_(pCVar2,&local_210);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::~CommaInitializer(&local_1c8);
  local_238 = 0.0;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator<<
            (&local_230,(DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&pi11,&local_238);
  dVar5 = sqrt(pi14 * pi14 + pi12 * pi12 + pi13 * pi13);
  dVar17 = pi12 * pi12;
  dVar12 = pi13 * pi13;
  dVar6 = dVar12 * nu11;
  dVar9 = dVar17 * nu11;
  dVar7 = pi14 * pi14;
  dVar14 = dVar7 * nu11;
  dVar10 = pi12 * pi21 * pi22;
  dVar15 = pi13 * pi21 * pi23;
  dVar16 = pi14 * pi21 * pi24;
  dVar13 = pi12 * pi13 * pi22 * pi23;
  dVar11 = pi12 * pi14 * pi22 * pi24;
  dVar8 = pi13 * pi14 * pi23 * pi24;
  local_240 = sqrt((((dVar7 * pi23 * pi23 +
                     dVar12 * pi24 * pi24 +
                     dVar7 * pi22 * pi22 +
                     dVar17 * pi24 * pi24 + dVar17 * pi23 * pi23 + dVar12 * pi22 * pi22) -
                    (dVar13 + dVar13)) - (dVar11 + dVar11)) - (dVar8 + dVar8));
  local_240 = ((-1.0 / dVar5) * ((((dVar14 + dVar9 + dVar6) - dVar10) - dVar15) - dVar16)) /
              local_240;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                     (&local_230,&local_240);
  dVar5 = pi21;
  local_248 = sqrt(pi14 * pi14 + pi12 * pi12 + pi13 * pi13);
  local_248 = dVar5 / local_248;
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_(pCVar3,&local_248);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::~CommaInitializer(&local_230);
  Eigen::MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::Identity(&local_24b,4,4);
  Eigen::Matrix<double,4,4,0,4,4>::operator=
            ((Matrix<double,4,4,0,4,4> *)local_b8,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
              *)&local_24b);
  Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topLeftCorner<int,int>
            (&local_288,(DenseBase<Eigen::Matrix<double,4,4,0,4,4>> *)local_b8,3,3);
  Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,-1,-1,false>::operator=
            ((Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false> *)&local_288,
             (DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
             (auxT.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2));
  Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topRightCorner<int,int>
            (&local_2c0,(DenseBase<Eigen::Matrix<double,4,4,0,4,4>> *)local_b8,3,1);
  Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,-1,-1,false>::operator=
            ((Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false> *)&local_2c0,
             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&pi11);
  if ((auxTrans.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0xf]._7_1_ & 1) != 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"[VERBOSE] Matrix [U,u;0,0,0,1]");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = Eigen::operator<<(poVar4,(DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)local_b8);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  if ((auxTrans.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0xf]._7_1_ & 1) != 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"[VERBOSE] inv(T)*T = eye(3)");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    local_2d8 = (XprTypeNested)
                Eigen::MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::inverse
                          ((MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)local_b8);
    local_2d0 = Eigen::MatrixBase<Eigen::Inverse<Eigen::Matrix<double,4,4,0,4,4>>>::operator*
                          ((MatrixBase<Eigen::Inverse<Eigen::Matrix<double,4,4,0,4,4>>> *)&local_2d8
                           ,(MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)local_b8);
    poVar4 = Eigen::operator<<(poVar4,(DenseBase<Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>_>
                                       *)&local_2d0);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  std::
  vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  ::push_back(__return_storage_ptr__,(value_type *)local_b8);
  dVar8 = nu14 * nu14;
  dVar5 = nu13 * nu13;
  dVar6 = pow(((dVar5 * nu22 + dVar8 * nu22) - nu12 * nu13 * nu23) - nu12 * nu14 * nu24,2.0);
  dVar7 = pow(nu13 * nu24 - nu14 * nu23,2.0);
  dVar5 = sqrt((dVar5 + dVar8) * dVar6 +
               dVar7 * (nu13 * nu13 + nu14 * nu14) * (nu14 * nu14 + nu12 * nu12 + nu13 * nu13));
  local_300 = (1.0 / dVar5) * (nu13 * nu24 - nu14 * nu23) * (nu13 * nu13 + nu14 * nu14);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator<<
            (&local_2f8,
             (DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
             (auxT.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2),&local_300);
  dVar8 = nu14 * nu14;
  dVar5 = nu13 * nu13;
  dVar6 = pow(((dVar5 * nu22 + dVar8 * nu22) - nu12 * nu13 * nu23) - nu12 * nu14 * nu24,2.0);
  dVar7 = pow(nu13 * nu24 - nu14 * nu23,2.0);
  dVar5 = sqrt((dVar5 + dVar8) * dVar6 +
               dVar7 * (nu13 * nu13 + nu14 * nu14) * (nu14 * nu14 + nu12 * nu12 + nu13 * nu13));
  local_308 = (-1.0 / dVar5) * (nu12 * nu24 - nu14 * nu22) * (nu13 * nu13 + nu14 * nu14);
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (&local_2f8,&local_308);
  dVar8 = nu14 * nu14;
  dVar5 = nu13 * nu13;
  dVar6 = pow(((dVar5 * nu22 + dVar8 * nu22) - nu12 * nu13 * nu23) - nu12 * nu14 * nu24,2.0);
  dVar7 = pow(nu13 * nu24 - nu14 * nu23,2.0);
  dVar5 = sqrt((dVar5 + dVar8) * dVar6 +
               dVar7 * (nu13 * nu13 + nu14 * nu14) * (nu14 * nu14 + nu12 * nu12 + nu13 * nu13));
  local_310 = (1.0 / dVar5) * (nu12 * nu23 - nu13 * nu22) * (nu13 * nu13 + nu14 * nu14);
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar2,&local_310);
  dVar8 = nu14 * nu14;
  dVar5 = nu13 * nu13;
  dVar6 = pow(((dVar5 * nu22 + dVar8 * nu22) - nu12 * nu13 * nu23) - nu12 * nu14 * nu24,2.0);
  dVar7 = pow(nu13 * nu24 - nu14 * nu23,2.0);
  dVar5 = sqrt((dVar5 + dVar8) * dVar6 +
               dVar7 * (nu13 * nu13 + nu14 * nu14) * (nu14 * nu14 + nu12 * nu12 + nu13 * nu13));
  dVar6 = nu14 * nu14;
  dVar8 = nu13 * nu13;
  dVar7 = sqrt(dVar6 + nu12 * nu12 + dVar8);
  local_318 = (((-1.0 / dVar5) * (dVar8 + dVar6)) / dVar7) *
              (((nu13 * nu13 * nu22 + nu14 * nu14 * nu22) - nu12 * nu13 * nu23) - nu12 * nu14 * nu24
              );
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar2,&local_318);
  dVar8 = nu14 * nu14;
  dVar5 = nu13 * nu13;
  dVar6 = pow(((dVar5 * nu22 + dVar8 * nu22) - nu12 * nu13 * nu23) - nu12 * nu14 * nu24,2.0);
  dVar7 = pow(nu13 * nu24 - nu14 * nu23,2.0);
  dVar5 = sqrt((dVar5 + dVar8) * dVar6 +
               dVar7 * (nu13 * nu13 + nu14 * nu14) * (nu14 * nu14 + nu12 * nu12 + nu13 * nu13));
  dVar6 = nu14 * nu14;
  dVar8 = nu13 * nu13;
  dVar7 = sqrt(dVar6 + nu12 * nu12 + dVar8);
  local_320 = (((-1.0 / dVar5) * (dVar8 + dVar6)) / dVar7) *
              (((nu12 * nu12 * nu23 + nu14 * nu14 * nu23) - nu12 * nu13 * nu22) - nu13 * nu14 * nu24
              );
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar2,&local_320);
  dVar8 = nu14 * nu14;
  dVar5 = nu13 * nu13;
  dVar6 = pow(((dVar5 * nu22 + dVar8 * nu22) - nu12 * nu13 * nu23) - nu12 * nu14 * nu24,2.0);
  dVar7 = pow(nu13 * nu24 - nu14 * nu23,2.0);
  dVar5 = sqrt((dVar5 + dVar8) * dVar6 +
               dVar7 * (nu13 * nu13 + nu14 * nu14) * (nu14 * nu14 + nu12 * nu12 + nu13 * nu13));
  dVar6 = nu14 * nu14;
  dVar8 = nu13 * nu13;
  dVar7 = sqrt(dVar6 + nu12 * nu12 + dVar8);
  local_328 = (((-1.0 / dVar5) * (dVar8 + dVar6)) / dVar7) *
              (((nu12 * nu12 * nu24 + nu13 * nu13 * nu24) - nu12 * nu14 * nu22) - nu13 * nu14 * nu23
              );
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar2,&local_328);
  dVar5 = nu12;
  local_330 = sqrt(nu14 * nu14 + nu12 * nu12 + nu13 * nu13);
  local_330 = dVar5 / local_330;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar2,&local_330);
  dVar5 = nu13;
  local_338 = sqrt(nu14 * nu14 + nu12 * nu12 + nu13 * nu13);
  local_338 = dVar5 / local_338;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar2,&local_338);
  dVar5 = nu14;
  local_340 = sqrt(nu14 * nu14 + nu12 * nu12 + nu13 * nu13);
  local_340 = dVar5 / local_340;
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_(pCVar2,&local_340);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::~CommaInitializer(&local_2f8);
  local_368 = 0.0;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator<<
            (&local_360,(DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&pi11,&local_368);
  dVar5 = sqrt(nu14 * nu14 + nu12 * nu12 + nu13 * nu13);
  dVar17 = nu12 * nu12;
  dVar12 = nu13 * nu13;
  dVar6 = dVar12 * local_1a8;
  dVar9 = dVar17 * local_1a8;
  dVar7 = nu14 * nu14;
  dVar14 = dVar7 * local_1a8;
  dVar10 = nu12 * nu21 * nu22;
  dVar15 = nu13 * nu21 * nu23;
  dVar16 = nu14 * nu21 * nu24;
  dVar13 = nu12 * nu13 * nu22 * nu23;
  dVar11 = nu12 * nu14 * nu22 * nu24;
  dVar8 = nu13 * nu14 * nu23 * nu24;
  local_370 = sqrt((((dVar7 * nu23 * nu23 +
                     dVar12 * nu24 * nu24 +
                     dVar7 * nu22 * nu22 +
                     dVar17 * nu24 * nu24 + dVar17 * nu23 * nu23 + dVar12 * nu22 * nu22) -
                    (dVar13 + dVar13)) - (dVar11 + dVar11)) - (dVar8 + dVar8));
  local_370 = ((-1.0 / dVar5) * ((((dVar14 + dVar9 + dVar6) - dVar10) - dVar15) - dVar16)) /
              local_370;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                     (&local_360,&local_370);
  dVar5 = nu21;
  local_378 = sqrt(nu14 * nu14 + nu12 * nu12 + nu13 * nu13);
  local_378 = dVar5 / local_378;
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_(pCVar3,&local_378);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::~CommaInitializer(&local_360);
  Eigen::MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::Identity(&local_37b,4,4);
  Eigen::Matrix<double,4,4,0,4,4>::operator=
            ((Matrix<double,4,4,0,4,4> *)local_b8,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
              *)&local_37b);
  Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topLeftCorner<int,int>
            (&local_3b8,(DenseBase<Eigen::Matrix<double,4,4,0,4,4>> *)local_b8,3,3);
  Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,-1,-1,false>::operator=
            ((Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false> *)&local_3b8,
             (DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
             (auxT.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2));
  Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topRightCorner<int,int>
            (&local_3f0,(DenseBase<Eigen::Matrix<double,4,4,0,4,4>> *)local_b8,3,1);
  Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,-1,-1,false>::operator=
            ((Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false> *)&local_3f0,
             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&pi11);
  if ((auxTrans.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0xf]._7_1_ & 1) != 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"[VERBOSE] Matrix [V,v;0,0,0,1]");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = Eigen::operator<<(poVar4,(DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)local_b8);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  if ((auxTrans.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0xf]._7_1_ & 1) != 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"[VERBOSE] inv(T)*T = eye(3)");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    local_408 = (XprTypeNested)
                Eigen::MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::inverse
                          ((MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)local_b8);
    local_400 = Eigen::MatrixBase<Eigen::Inverse<Eigen::Matrix<double,4,4,0,4,4>>>::operator*
                          ((MatrixBase<Eigen::Inverse<Eigen::Matrix<double,4,4,0,4,4>>> *)&local_408
                           ,(MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)local_b8);
    poVar4 = Eigen::operator<<(poVar4,(DenseBase<Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>_>
                                       *)&local_400);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  std::
  vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  ::push_back(__return_storage_ptr__,(value_type *)local_b8);
  return __return_storage_ptr__;
}

Assistant:

vector<Matrix<floatPrec, 4, 4>> getPredefinedTransformations2Plane1Line(
	Matrix<floatPrec, 4, 1> Pi1, Matrix<floatPrec, 4, 1> Pi2,
	Matrix<floatPrec, 4, 1> Nu1, Matrix<floatPrec, 4, 1> Nu2,
	bool verbose)
{

	vector<Matrix<floatPrec, 4, 4>> outTrans;
	Matrix<floatPrec, 4, 4> auxTrans;
	Matrix<floatPrec, 3, 3> auxRot;
	Matrix<floatPrec, 3, 1> auxT;

	floatPrec pi11, pi12, pi13, pi14;
	floatPrec pi21, pi22, pi23, pi24;
	floatPrec nu11, nu12, nu13, nu14;
	floatPrec nu21, nu22, nu23, nu24;

	pi11 = Pi1(0);
	pi12 = Pi1(1);
	pi13 = Pi1(2);
	pi14 = Pi1(3);
	pi21 = Pi2(0);
	pi22 = Pi2(1);
	pi23 = Pi2(2);
	pi24 = Pi2(3);
	nu11 = Nu1(0);
	nu12 = Nu1(1);
	nu13 = Nu1(2);
	nu14 = Nu1(3);
	nu21 = Nu2(0);
	nu22 = Nu2(1);
	nu23 = Nu2(2);
	nu24 = Nu2(3);

	// Compute U Matrix
	auxRot << 1.0 / sqrt((pi12 * pi12 + pi13 * pi13) * pow((pi12 * pi12) * pi21 + (pi13 * pi13) * pi21 - pi11 * pi12 * pi22 - pi11 * pi13 * pi23, 2.0) + pow(pi12 * pi23 - pi13 * pi22, 2.0) * (pi12 * pi12 + pi13 * pi13) * (pi11 * pi11 + pi12 * pi12 + pi13 * pi13)) * (pi12 * pi23 - pi13 * pi22) * (pi12 * pi12 + pi13 * pi13),
		-1.0 / sqrt((pi12 * pi12 + pi13 * pi13) * pow((pi12 * pi12) * pi21 + (pi13 * pi13) * pi21 - pi11 * pi12 * pi22 - pi11 * pi13 * pi23, 2.0) + pow(pi12 * pi23 - pi13 * pi22, 2.0) * (pi12 * pi12 + pi13 * pi13) * (pi11 * pi11 + pi12 * pi12 + pi13 * pi13)) * (pi11 * pi23 - pi13 * pi21) * (pi12 * pi12 + pi13 * pi13),
		1.0 / sqrt((pi12 * pi12 + pi13 * pi13) * pow((pi12 * pi12) * pi21 + (pi13 * pi13) * pi21 - pi11 * pi12 * pi22 - pi11 * pi13 * pi23, 2.0) + pow(pi12 * pi23 - pi13 * pi22, 2.0) * (pi12 * pi12 + pi13 * pi13) * (pi11 * pi11 + pi12 * pi12 + pi13 * pi13)) * (pi11 * pi22 - pi12 * pi21) * (pi12 * pi12 + pi13 * pi13),
		-1.0 / sqrt((pi12 * pi12 + pi13 * pi13) * pow((pi12 * pi12) * pi21 + (pi13 * pi13) * pi21 - pi11 * pi12 * pi22 - pi11 * pi13 * pi23, 2.0) + pow(pi12 * pi23 - pi13 * pi22, 2.0) * (pi12 * pi12 + pi13 * pi13) * (pi11 * pi11 + pi12 * pi12 + pi13 * pi13)) * (pi12 * pi12 + pi13 * pi13) * 1.0 / sqrt(pi11 * pi11 + pi12 * pi12 + pi13 * pi13) * ((pi12 * pi12) * pi21 + (pi13 * pi13) * pi21 - pi11 * pi12 * pi22 - pi11 * pi13 * pi23),
		-1.0 / sqrt((pi12 * pi12 + pi13 * pi13) * pow((pi12 * pi12) * pi21 + (pi13 * pi13) * pi21 - pi11 * pi12 * pi22 - pi11 * pi13 * pi23, 2.0) + pow(pi12 * pi23 - pi13 * pi22, 2.0) * (pi12 * pi12 + pi13 * pi13) * (pi11 * pi11 + pi12 * pi12 + pi13 * pi13)) * (pi12 * pi12 + pi13 * pi13) * 1.0 / sqrt(pi11 * pi11 + pi12 * pi12 + pi13 * pi13) * ((pi11 * pi11) * pi22 + (pi13 * pi13) * pi22 - pi11 * pi12 * pi21 - pi12 * pi13 * pi23),
		-1.0 / sqrt((pi12 * pi12 + pi13 * pi13) * pow((pi12 * pi12) * pi21 + (pi13 * pi13) * pi21 - pi11 * pi12 * pi22 - pi11 * pi13 * pi23, 2.0) + pow(pi12 * pi23 - pi13 * pi22, 2.0) * (pi12 * pi12 + pi13 * pi13) * (pi11 * pi11 + pi12 * pi12 + pi13 * pi13)) * (pi12 * pi12 + pi13 * pi13) * 1.0 / sqrt(pi11 * pi11 + pi12 * pi12 + pi13 * pi13) * ((pi11 * pi11) * pi23 + (pi12 * pi12) * pi23 - pi11 * pi13 * pi21 - pi12 * pi13 * pi22),
		pi11 * 1.0 / sqrt(pi11 * pi11 + pi12 * pi12 + pi13 * pi13),
		pi12 * 1.0 / sqrt(pi11 * pi11 + pi12 * pi12 + pi13 * pi13),
		pi13 * 1.0 / sqrt(pi11 * pi11 + pi12 * pi12 + pi13 * pi13);

	// Compute u vector
	auxT << 0.0,
		-1.0 / sqrt(pi11 * pi11 + pi12 * pi12 + pi13 * pi13) * ((pi11 * pi11) * pi24 + (pi12 * pi12) * pi24 + (pi13 * pi13) * pi24 - pi11 * pi14 * pi21 - pi12 * pi14 * pi22 - pi13 * pi14 * pi23) * 1.0 / sqrt((pi11 * pi11) * (pi22 * pi22) + (pi12 * pi12) * (pi21 * pi21) + (pi11 * pi11) * (pi23 * pi23) + (pi13 * pi13) * (pi21 * pi21) + (pi12 * pi12) * (pi23 * pi23) + (pi13 * pi13) * (pi22 * pi22) - pi11 * pi12 * pi21 * pi22 * 2.0 - pi11 * pi13 * pi21 * pi23 * 2.0 - pi12 * pi13 * pi22 * pi23 * 2.0),
		pi14 * 1.0 / sqrt(pi11 * pi11 + pi12 * pi12 + pi13 * pi13);

	auxTrans = Matrix<floatPrec, 4, 4>::Identity(4, 4);
	auxTrans.topLeftCorner(3, 3) = auxRot;
	auxTrans.topRightCorner(3, 1) = auxT;

	if (verbose)
		cout << "[VERBOSE] Matrix [U,u;0,0,0,1]" << endl
			 << auxTrans << endl;
	if (verbose)
		cout << "[VERBOSE] inv(T)*T = eye(3)" << endl
			 << auxTrans.inverse() * auxTrans << endl;

	// add U,u to the output vector
	outTrans.push_back(auxTrans);

	// Compute V Matrix
	auxRot << 1.0 / sqrt((nu12 * nu12 + nu13 * nu13) * pow((nu12 * nu12) * nu21 + (nu13 * nu13) * nu21 - nu11 * nu12 * nu22 - nu11 * nu13 * nu23, 2.0) + pow(nu12 * nu23 - nu13 * nu22, 2.0) * (nu12 * nu12 + nu13 * nu13) * (nu11 * nu11 + nu12 * nu12 + nu13 * nu13)) * (nu12 * nu23 - nu13 * nu22) * (nu12 * nu12 + nu13 * nu13),
		-1.0 / sqrt((nu12 * nu12 + nu13 * nu13) * pow((nu12 * nu12) * nu21 + (nu13 * nu13) * nu21 - nu11 * nu12 * nu22 - nu11 * nu13 * nu23, 2.0) + pow(nu12 * nu23 - nu13 * nu22, 2.0) * (nu12 * nu12 + nu13 * nu13) * (nu11 * nu11 + nu12 * nu12 + nu13 * nu13)) * (nu11 * nu23 - nu13 * nu21) * (nu12 * nu12 + nu13 * nu13),
		1.0 / sqrt((nu12 * nu12 + nu13 * nu13) * pow((nu12 * nu12) * nu21 + (nu13 * nu13) * nu21 - nu11 * nu12 * nu22 - nu11 * nu13 * nu23, 2.0) + pow(nu12 * nu23 - nu13 * nu22, 2.0) * (nu12 * nu12 + nu13 * nu13) * (nu11 * nu11 + nu12 * nu12 + nu13 * nu13)) * (nu11 * nu22 - nu12 * nu21) * (nu12 * nu12 + nu13 * nu13),
		-1.0 / sqrt((nu12 * nu12 + nu13 * nu13) * pow((nu12 * nu12) * nu21 + (nu13 * nu13) * nu21 - nu11 * nu12 * nu22 - nu11 * nu13 * nu23, 2.0) + pow(nu12 * nu23 - nu13 * nu22, 2.0) * (nu12 * nu12 + nu13 * nu13) * (nu11 * nu11 + nu12 * nu12 + nu13 * nu13)) * (nu12 * nu12 + nu13 * nu13) * 1.0 / sqrt(nu11 * nu11 + nu12 * nu12 + nu13 * nu13) * ((nu12 * nu12) * nu21 + (nu13 * nu13) * nu21 - nu11 * nu12 * nu22 - nu11 * nu13 * nu23),
		-1.0 / sqrt((nu12 * nu12 + nu13 * nu13) * pow((nu12 * nu12) * nu21 + (nu13 * nu13) * nu21 - nu11 * nu12 * nu22 - nu11 * nu13 * nu23, 2.0) + pow(nu12 * nu23 - nu13 * nu22, 2.0) * (nu12 * nu12 + nu13 * nu13) * (nu11 * nu11 + nu12 * nu12 + nu13 * nu13)) * (nu12 * nu12 + nu13 * nu13) * 1.0 / sqrt(nu11 * nu11 + nu12 * nu12 + nu13 * nu13) * ((nu11 * nu11) * nu22 + (nu13 * nu13) * nu22 - nu11 * nu12 * nu21 - nu12 * nu13 * nu23),
		-1.0 / sqrt((nu12 * nu12 + nu13 * nu13) * pow((nu12 * nu12) * nu21 + (nu13 * nu13) * nu21 - nu11 * nu12 * nu22 - nu11 * nu13 * nu23, 2.0) + pow(nu12 * nu23 - nu13 * nu22, 2.0) * (nu12 * nu12 + nu13 * nu13) * (nu11 * nu11 + nu12 * nu12 + nu13 * nu13)) * (nu12 * nu12 + nu13 * nu13) * 1.0 / sqrt(nu11 * nu11 + nu12 * nu12 + nu13 * nu13) * ((nu11 * nu11) * nu23 + (nu12 * nu12) * nu23 - nu11 * nu13 * nu21 - nu12 * nu13 * nu22),
		nu11 * 1.0 / sqrt(nu11 * nu11 + nu12 * nu12 + nu13 * nu13),
		nu12 * 1.0 / sqrt(nu11 * nu11 + nu12 * nu12 + nu13 * nu13),
		nu13 * 1.0 / sqrt(nu11 * nu11 + nu12 * nu12 + nu13 * nu13);

	// Compute v vector
	auxT << 0.0,
		-1.0 / sqrt(nu11 * nu11 + nu12 * nu12 + nu13 * nu13) * ((nu11 * nu11) * nu24 + (nu12 * nu12) * nu24 + (nu13 * nu13) * nu24 - nu11 * nu14 * nu21 - nu12 * nu14 * nu22 - nu13 * nu14 * nu23) * 1.0 / sqrt((nu11 * nu11) * (nu22 * nu22) + (nu12 * nu12) * (nu21 * nu21) + (nu11 * nu11) * (nu23 * nu23) + (nu13 * nu13) * (nu21 * nu21) + (nu12 * nu12) * (nu23 * nu23) + (nu13 * nu13) * (nu22 * nu22) - nu11 * nu12 * nu21 * nu22 * 2.0 - nu11 * nu13 * nu21 * nu23 * 2.0 - nu12 * nu13 * nu22 * nu23 * 2.0),
		nu14 * 1.0 / sqrt(nu11 * nu11 + nu12 * nu12 + nu13 * nu13);

	auxTrans = Matrix<floatPrec, 4, 4>::Identity(4, 4);
	auxTrans.topLeftCorner(3, 3) = auxRot;
	auxTrans.topRightCorner(3, 1) = auxT;

	if (verbose)
		cout << "[VERBOSE] Matrix [V,v;0,0,0,1]" << endl
			 << auxTrans << endl;
	if (verbose)
		cout << "[VERBOSE] inv(T)*T = eye(3)" << endl
			 << auxTrans.inverse() * auxTrans << endl;

	// add V,v to the output vector
	outTrans.push_back(auxTrans);

	return outTrans;
}